

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagator.cpp
# Opt level: O3

void __thiscall Propagator::propagate(Propagator *this,Wave *wave)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer paVar5;
  uint *puVar6;
  pointer ptVar7;
  uint *puVar8;
  uint x;
  uint uVar9;
  long lVar10;
  uint y;
  
  ptVar7 = (this->propagating).
           super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar7 != (this->propagating).
                super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    do {
      uVar2 = ptVar7[-1].super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
              super__Head_base<0UL,_unsigned_int,_false>._M_head_impl;
      uVar3 = ptVar7[-1].super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<2UL,_unsigned_int>.super__Head_base<2UL,_unsigned_int,_false>.
              _M_head_impl;
      uVar4 = ptVar7[-1].super__Tuple_impl<0UL,_unsigned_int,_unsigned_int,_unsigned_int>.
              super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.
              super__Head_base<1UL,_unsigned_int,_false>._M_head_impl;
      (this->propagating).
      super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ptVar7 + -1;
      lVar10 = 0;
      do {
        x = directions_x[lVar10] + uVar4;
        if (this->periodic_output == true) {
          uVar9 = wave->width;
          x = (x + uVar9) % uVar9;
          y = (directions_y[lVar10] + uVar2 + wave->height) % wave->height;
LAB_001032b5:
          paVar5 = (this->propagator_state).
                   super__Vector_base<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>,_std::allocator<std::array<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          puVar8 = *(uint **)&paVar5[uVar3]._M_elems[lVar10].
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl;
          puVar6 = *(pointer *)
                    ((long)&paVar5[uVar3]._M_elems[lVar10].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    + 8);
          if (puVar8 < puVar6) {
            do {
              piVar1 = (this->compatible).data.
                       super__Vector_base<std::array<int,_4UL>,_std::allocator<std::array<int,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [((this->compatible).width * (long)(int)y + (long)(int)x) *
                        (this->compatible).depth + (ulong)*puVar8]._M_elems + lVar10;
              *piVar1 = *piVar1 + -1;
              if (*piVar1 == 0) {
                add_to_propagator(this,y,x,*puVar8);
                Wave::set(wave,uVar9 * y + x,*puVar8,false);
              }
              puVar8 = puVar8 + 1;
            } while (puVar8 < puVar6);
          }
        }
        else {
          uVar9 = wave->width;
          if ((((int)x < (int)uVar9 && -1 < (int)x) &&
              (y = directions_y[lVar10] + uVar2, -1 < (int)y)) && ((int)y < (int)wave->height))
          goto LAB_001032b5;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      ptVar7 = (this->propagating).
               super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while (ptVar7 != (this->propagating).
                       super__Vector_base<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>,_std::allocator<std::tuple<unsigned_int,_unsigned_int,_unsigned_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Propagator::propagate(Wave &wave) noexcept {

  // We propagate every element while there is element to propagate.
  while (propagating.size() != 0) {

    // The cell and pattern that has been set to false.
    unsigned y1, x1, pattern;
    std::tie(y1, x1, pattern) = propagating.back();
    propagating.pop_back();

    // We propagate the information in all 4 directions.
    for (unsigned direction = 0; direction < 4; direction++) {

      // We get the next cell in the direction direction.
      int dx = directions_x[direction];
      int dy = directions_y[direction];
      int x2, y2;
      if (periodic_output) {
        x2 = ((int)x1 + dx + (int)wave.width) % wave.width;
        y2 = ((int)y1 + dy + (int)wave.height) % wave.height;
      } else {
        x2 = x1 + dx;
        y2 = y1 + dy;
        if (x2 < 0 || x2 >= (int)wave.width) {
          continue;
        }
        if (y2 < 0 || y2 >= (int)wave.height) {
          continue;
        }
      }

      // The index of the second cell, and the patterns compatible
      unsigned i2 = x2 + y2 * wave.width;
      const std::vector<unsigned> &patterns =
        propagator_state[pattern][direction];

      // For every pattern that could be placed in that cell without being in
      // contradiction with pattern1
      for (auto it = patterns.begin(), it_end = patterns.end(); it < it_end;
           ++it) {

        // We decrease the number of compatible patterns in the opposite
        // direction If the pattern was discarded from the wave, the element
        // is still negative, which is not a problem
        std::array<int, 4> &value = compatible.get(y2, x2, *it);
        value[direction]--;

        // If the element was set to 0 with this operation, we need to remove
        // the pattern from the wave, and propagate the information
        if (value[direction] == 0) {
          add_to_propagator(y2, x2, *it);
          wave.set(i2, *it, false);
        }
      }
    }
  }
}